

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.hpp
# Opt level: O0

unsigned_short duckdb::Cast::Operation<unsigned_char,_unsigned_short>(uchar input)

{
  bool bVar1;
  InvalidInputException *this;
  unsigned_short result;
  uchar in_stack_000001af;
  string *in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  unsigned_short local_4;
  
  bVar1 = TryCast::Operation<unsigned_char,_unsigned_short>
                    ((uint8_t)((ulong)in_stack_ffffffffffffffc0 >> 0x38),
                     (uint16_t *)in_stack_ffffffffffffffb8,false);
  if (!bVar1) {
    this = (InvalidInputException *)__cxa_allocate_exception(0x10);
    CastExceptionText<unsigned_char,_unsigned_short>(in_stack_000001af);
    InvalidInputException::InvalidInputException(this,in_stack_ffffffffffffffb8);
    __cxa_throw(this,&InvalidInputException::typeinfo,InvalidInputException::~InvalidInputException)
    ;
  }
  return local_4;
}

Assistant:

static inline DST Operation(SRC input) {
		DST result;
		if (!TryCast::Operation(input, result)) {
			throw InvalidInputException(CastExceptionText<SRC, DST>(input));
		}
		return result;
	}